

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O3

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  double dVar1;
  char *__dest;
  size_t __n;
  size_t sVar2;
  ulong elementCount;
  char *pcVar3;
  Array<char> buf_heap;
  char buf_stack [128];
  char *pcVar4;
  ulong uVar5;
  undefined8 *local_c8;
  StringPtr local_b8;
  char local_a8 [128];
  
  __n = digits->size_;
  sVar2 = __n + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar2 = __n;
  }
  if ((exponent->ptr).isSet == true) {
    sVar2 = sVar2 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  elementCount = sVar2 + 1;
  if (elementCount < 0x81) {
    local_c8 = (undefined8 *)0x0;
    __dest = local_a8;
    pcVar4 = (char *)0x0;
    uVar5 = 0;
  }
  else {
    __dest = (char *)kj::_::HeapArrayDisposer::allocateImpl
                               (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    local_c8 = &kj::_::HeapArrayDisposer::instance;
    __n = digits->size_;
    pcVar4 = __dest;
    uVar5 = elementCount;
  }
  memcpy(__dest,digits->ptr,__n);
  pcVar3 = __dest + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar3 = '.';
    memcpy(pcVar3 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar3 = pcVar3 + 1 + (fraction->ptr).field_1.value.size_;
  }
  if ((exponent->ptr).isSet == true) {
    *pcVar3 = 'e';
    if ((exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
        == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar3 + 1) =
           (exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
      pcVar3 = pcVar3 + 2;
    }
    else {
      pcVar3 = pcVar3 + 1;
    }
    memcpy(pcVar3,*(void **)((long)&(exponent->ptr).field_1 + 8),
           *(size_t *)((long)&(exponent->ptr).field_1 + 0x10));
    pcVar3 = pcVar3 + *(long *)((long)&(exponent->ptr).field_1 + 0x10);
  }
  *pcVar3 = '\0';
  local_b8.content.ptr = __dest;
  local_b8.content.size_ = elementCount;
  dVar1 = StringPtr::parseAs<double>(&local_b8);
  if (pcVar4 != (char *)0x0) {
    (**(code **)*local_c8)(local_c8,pcVar4,1,uVar5,uVar5,0,0,0);
  }
  return dVar1;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_SOME(f, fraction) {
    bufSize += 1 + f.size();
  }
  KJ_IF_SOME(e, exponent) {
    bufSize += 1 + (get<0>(e) != kj::none) + get<1>(e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_SOME(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f.begin(), f.size());
    pos += f.size();
  }
  KJ_IF_SOME(e, exponent) {
    *pos++ = 'e';
    KJ_IF_SOME(sign, get<0>(e)) {
      *pos++ = sign;
    }
    memcpy(pos, get<1>(e).begin(), get<1>(e).size());
    pos += get<1>(e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  // The above construction should always produce a valid double, so this should never throw...
  return StringPtr(buf.begin(), bufSize).parseAs<double>();
}